

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void anon_unknown.dwarf_aa461::ClearLoadStoreInfoAliasing(VmModule *module,VmInstruction *storeInst)

{
  VariableData *pVVar1;
  uint uVar2;
  LoadStoreInfo *pLVar3;
  VmConstant **ppVVar4;
  VmValue **ppVVar5;
  LoadStoreInfo *pLVar6;
  bool bVar7;
  VariableData *container;
  bool hasStore;
  LoadStoreInfo *el;
  uint i;
  VmInstruction *storeInst_local;
  VmModule *module_local;
  
  el._4_4_ = 0;
  do {
    while( true ) {
      while( true ) {
        uVar2 = SmallArray<VmModule::LoadStoreInfo,_32U>::size(&module->loadStoreInfo);
        if (uVar2 <= el._4_4_) {
          return;
        }
        pLVar3 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[]
                           (&module->loadStoreInfo,el._4_4_);
        if (((pLVar3->noLoadOrNoContainerAlias & 1U) != 0) &&
           ((pLVar3->noStoreOrNoContainerAlias & 1U) != 0)) break;
        if (((storeInst == (VmInstruction *)0x0) || (pLVar3->loadInst == (VmInstruction *)0x0)) ||
           (bVar7 = IsLoadAliasedWithStore(pLVar3->loadInst,storeInst), bVar7)) {
          pLVar3 = SmallArray<VmModule::LoadStoreInfo,_32U>::back(&module->loadStoreInfo);
          pLVar6 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[]
                             (&module->loadStoreInfo,el._4_4_);
          memcpy(pLVar6,pLVar3,0x52);
          SmallArray<VmModule::LoadStoreInfo,_32U>::pop_back(&module->loadStoreInfo);
        }
        else {
          el._4_4_ = el._4_4_ + 1;
        }
      }
      bVar7 = true;
      if (pLVar3->storeAddress == (VmConstant *)0x0) {
        bVar7 = pLVar3->storePointer != (VmValue *)0x0;
      }
      if ((((bVar7) && (pLVar3->storeAddress != (VmConstant *)0x0)) &&
          (pVVar1 = pLVar3->storeAddress->container, (pVVar1->users).count == 1)) &&
         (ppVVar4 = SmallArray<VmConstant_*,_8U>::operator[](&pVVar1->users,0),
         ((*ppVVar4)->super_VmValue).users.count == 1)) break;
LAB_0021af2f:
      el._4_4_ = el._4_4_ + 1;
    }
    ppVVar4 = SmallArray<VmConstant_*,_8U>::operator[](&pVVar1->users,0);
    ppVVar5 = SmallArray<VmValue_*,_8U>::operator[](&((*ppVVar4)->super_VmValue).users,0);
    if ((VmInstruction *)*ppVVar5 != pLVar3->storeInst) goto LAB_0021af2f;
    pLVar3 = SmallArray<VmModule::LoadStoreInfo,_32U>::back(&module->loadStoreInfo);
    pLVar6 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](&module->loadStoreInfo,el._4_4_);
    memcpy(pLVar6,pLVar3,0x52);
    SmallArray<VmModule::LoadStoreInfo,_32U>::pop_back(&module->loadStoreInfo);
  } while( true );
}

Assistant:

void ClearLoadStoreInfoAliasing(VmModule *module, VmInstruction *storeInst)
	{
		for(unsigned i = 0; i < module->loadStoreInfo.size();)
		{
			VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

			if(el.noLoadOrNoContainerAlias && el.noStoreOrNoContainerAlias)
			{
				bool hasStore = el.storeAddress || el.storePointer;

				// Check if there is only a dead store user for this simple-use variable
				if(hasStore && el.storeAddress)
				{
					VariableData *container = el.storeAddress->container;

					if(container->users.count == 1 && container->users[0]->users.count == 1 && container->users[0]->users[0] == el.storeInst)
					{
						module->loadStoreInfo[i] = module->loadStoreInfo.back();
						module->loadStoreInfo.pop_back();
						continue;
					}
				}

				i++;
				continue;
			}

			// If a potentially aliasing store is made, check strict aliasing to the load instruction
			if(storeInst && el.loadInst && !IsLoadAliasedWithStore(el.loadInst, storeInst))
			{
				i++;
				continue;
			}

			module->loadStoreInfo[i] = module->loadStoreInfo.back();
			module->loadStoreInfo.pop_back();
		}
	}